

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_2.cpp
# Opt level: O0

int main(void)

{
  char op_00;
  int iVar1;
  ostream *poVar2;
  allocator<char> local_91;
  int c;
  char local_6a;
  allocator<char> local_69;
  undefined1 local_68 [6];
  char op;
  int local_48;
  int b;
  allocator<char> local_31;
  string local_30;
  int local_10;
  undefined4 local_c;
  int a;
  
  local_c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"First number",&local_31);
  iVar1 = get_number(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_10 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,"Second number",&local_69);
  iVar1 = get_number((string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::allocator<char>::~allocator(&local_69);
  local_48 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&c,"Operator [+ - * /]",&local_91);
  op_00 = get_sym((string *)&c);
  std::__cxx11::string::~string((string *)&c);
  std::allocator<char>::~allocator(&local_91);
  local_6a = op_00;
  iVar1 = evaluate(local_10,local_48,op_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"Result of ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_10);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,local_6a);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_48);
  poVar2 = std::operator<<(poVar2," = ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main()
{
	int const a = get_number("First number");
	int const b = get_number("Second number");
	char const op = get_sym("Operator [+ - * /]");
	int const c = evaluate(a, b, op);

	cout << "Result of " << a << " " << op << " " << b << " = " << c << '\n';

	return EXIT_SUCCESS;
}